

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O0

void PixelToaster::convert_XBGRFFFF_to_XBGRFFFF(Pixel *source,Pixel *destination,uint count)

{
  uint count_local;
  Pixel *destination_local;
  Pixel *source_local;
  
  memcpy(destination,source,(ulong)(count << 4));
  return;
}

Assistant:

inline void convert_XBGRFFFF_to_XBGRFFFF(const Pixel source[], Pixel destination[], unsigned int count)
{
#ifndef PIXELTOASTER_NO_CRT
    memcpy(destination, source, count * 16);
#else
    for (unsigned int i = 0; i < count; ++i)
        destination[i] = source[i];
#endif
}